

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvlTree.h
# Opt level: O2

int __thiscall AvlTree<Worker>::find(AvlTree<Worker> *this,Worker *obj)

{
  int iVar1;
  int iVar2;
  __shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2> *__r;
  long local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  shared_ptr<AvlTree<Worker>::Node> it;
  
  std::__shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&it.super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2> *)this);
  iVar2 = 0;
  do {
    if (it.super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      iVar1 = -1;
LAB_00102c16:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&it.super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      return iVar1;
    }
    iVar1 = ((it.super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->key)
            .Salary;
    __r = &((it.super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->left)
           .super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>;
    if (iVar1 <= obj->Salary) {
      if (obj->Salary <= iVar1) {
        std::__shared_ptr<AvlTree<Worker>::Node_const,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<AvlTree<Worker>::Node,void>
                  ((__shared_ptr<AvlTree<Worker>::Node_const,(__gnu_cxx::_Lock_policy)2> *)&local_50
                   ,__r);
        if (local_50 == 0) {
          iVar1 = 0;
        }
        else {
          iVar1 = *(int *)(local_50 + 0x4c);
        }
        iVar1 = iVar1 + iVar2;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
        goto LAB_00102c16;
      }
      std::__shared_ptr<AvlTree<Worker>::Node_const,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<AvlTree<Worker>::Node,void>
                ((__shared_ptr<AvlTree<Worker>::Node_const,(__gnu_cxx::_Lock_policy)2> *)&local_50,
                 __r);
      iVar1 = 1;
      if (local_50 != 0) {
        iVar1 = *(int *)(local_50 + 0x4c) + 1;
      }
      iVar2 = iVar2 + iVar1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
      __r = &((it.super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             right).super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::__shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&it.super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>,__r);
  } while( true );
}

Assistant:

int find(const T& obj) const
    {
        int foundIndex = 0;
        auto it = m_Root;

        while(it != nullptr)
        {
            if(!(obj < it->key) && !(it->key < obj))
                return foundIndex + _size(it->left);
            if(obj < it->key)
            {
                it = it->left;
            }
            else
            {
                foundIndex += _size(it->left) + 1;
                it = it->right;
            }
        }
        return -1;
    }